

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  bool bVar2;
  CppType CVar3;
  CppType CVar4;
  int32 iVar5;
  int32 iVar6;
  uint32 uVar7;
  uint32 uVar8;
  LogMessage *pLVar9;
  string *__lhs;
  string *__rhs;
  int64 iVar10;
  int64 iVar11;
  uint64 uVar12;
  uint64 uVar13;
  LogFinisher local_59;
  LogMessage local_58;
  
  CVar3 = MapKey::type(a);
  CVar4 = MapKey::type(b);
  if (CVar3 != CVar4) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x399);
    pLVar9 = LogMessage::operator<<(&local_58,"CHECK failed: a.type() == b.type(): ");
    LogFinisher::operator=(&local_59,pLVar9);
    LogMessage::~LogMessage(&local_58);
  }
  CVar3 = MapKey::type(a);
  switch(CVar3) {
  case CPPTYPE_INT32:
    iVar5 = MapKey::GetInt32Value(a);
    iVar6 = MapKey::GetInt32Value(b);
    bVar2 = SBORROW4(iVar5,iVar6);
    bVar1 = iVar5 - iVar6 < 0;
    goto LAB_0060f1a9;
  case CPPTYPE_INT64:
    iVar10 = MapKey::GetInt64Value(a);
    iVar11 = MapKey::GetInt64Value(b);
    bVar2 = SBORROW8(iVar10,iVar11);
    bVar1 = iVar10 - iVar11 < 0;
LAB_0060f1a9:
    bVar1 = bVar2 != bVar1;
    break;
  case CPPTYPE_UINT32:
    uVar7 = MapKey::GetUInt32Value(a);
    uVar8 = MapKey::GetUInt32Value(b);
    bVar1 = uVar7 < uVar8;
    break;
  case CPPTYPE_UINT64:
    uVar12 = MapKey::GetUInt64Value(a);
    uVar13 = MapKey::GetUInt64Value(b);
    bVar1 = uVar12 < uVar13;
    break;
  default:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x3a8);
    pLVar9 = LogMessage::operator<<(&local_58,"Invalid key for map field.");
    LogFinisher::operator=(&local_59,pLVar9);
    LogMessage::~LogMessage(&local_58);
    bVar1 = true;
    break;
  case CPPTYPE_BOOL:
    bVar2 = MapKey::GetBoolValue(a);
    bVar1 = MapKey::GetBoolValue(b);
    bVar1 = !bVar2 && bVar1;
    break;
  case CPPTYPE_STRING:
    __lhs = MapKey::GetStringValue_abi_cxx11_(a);
    __rhs = MapKey::GetStringValue_abi_cxx11_(b);
    bVar1 = std::operator<(__lhs,__rhs);
  }
  return bVar1;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      GOOGLE_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
          return true;
      }
    }